

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

ssl_connect_data * cf_ctx_new(Curl_easy *data,alpn_spec *alpn)

{
  Curl_llist_node *pCVar1;
  ssl_connect_data *ctx;
  alpn_spec *alpn_local;
  Curl_easy *data_local;
  
  data_local = (Curl_easy *)(*Curl_ccalloc)(1,0xd0);
  if (data_local == (Curl_easy *)0x0) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    *(Curl_ssl **)data_local = Curl_ssl;
    (data_local->msg).list._ptr = alpn;
    Curl_bufq_init2((bufq *)&data_local->multi,0x10000,1,2);
    pCVar1 = (Curl_llist_node *)(*Curl_ccalloc)(1,*(size_t *)(*(long *)data_local + 0x18));
    (data_local->msg).list._prev = pCVar1;
    if ((data_local->msg).list._prev == (Curl_llist_node *)0x0) {
      (*Curl_cfree)(data_local);
      data_local = (Curl_easy *)0x0;
    }
  }
  return (ssl_connect_data *)data_local;
}

Assistant:

static struct ssl_connect_data *cf_ctx_new(struct Curl_easy *data,
                                           const struct alpn_spec *alpn)
{
  struct ssl_connect_data *ctx;

  (void)data;
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx)
    return NULL;

  ctx->ssl_impl = Curl_ssl;
  ctx->alpn = alpn;
  Curl_bufq_init2(&ctx->earlydata, CURL_SSL_EARLY_MAX, 1, BUFQ_OPT_NO_SPARES);
  ctx->backend = calloc(1, ctx->ssl_impl->sizeof_ssl_backend_data);
  if(!ctx->backend) {
    free(ctx);
    return NULL;
  }
  return ctx;
}